

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_address.cpp
# Opt level: O3

Address * __thiscall
cfd::api::AddressApi::CreateMultisig
          (Address *__return_storage_ptr__,AddressApi *this,NetType net_type,
          AddressType address_type,uint32_t req_sig_num,
          vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *pubkeys,
          Script *redeem_script,Script *witness_script,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *prefix_list)

{
  CfdException *this_00;
  Script script;
  Script multisig_script;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_238;
  AddressType local_21c;
  Script local_218;
  Script local_1e0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [32];
  pointer local_178;
  pointer local_160;
  pointer local_148;
  TapBranch local_130;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b8;
  Script local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_21c = address_type;
  core::ScriptUtil::CreateMultisigRedeemScript(&local_1e0,req_sig_num,pubkeys,true);
  local_238.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (prefix_list ==
      (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0) {
    core::GetBitcoinAddressFormatList();
    local_198._0_8_ =
         local_238.
         super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1a8._8_8_ =
         local_238.
         super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1a8._0_8_ =
         local_238.
         super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_238.
    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_218.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    local_238.
    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_218._vptr_Script;
    local_238.
    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_218.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_218._vptr_Script = (_func_int **)0x0;
    local_218.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_218.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            local_1a8);
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            &local_218);
  }
  else {
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    operator=(&local_238,prefix_list);
  }
  core::Address::Address(__return_storage_ptr__);
  core::Script::Script(&local_218);
  if (address_type == kP2shP2wshAddress) {
    core::ScriptUtil::CreateP2wshLockingScript((Script *)local_1a8,&local_1e0);
    core::Script::operator=(&local_218,(Script *)local_1a8);
    core::Script::~Script((Script *)local_1a8);
    core::Address::Address((Address *)local_1a8,net_type,&local_218,&local_238);
    core::Address::operator=(__return_storage_ptr__,(Address *)local_1a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_60);
    core::Script::~Script(&local_a0);
    local_130._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_b8)
    ;
    core::TapBranch::~TapBranch(&local_130);
    if (local_148 != (pointer)0x0) {
      operator_delete(local_148);
    }
    if (local_160 != (pointer)0x0) {
      operator_delete(local_160);
    }
    if (local_178 != (pointer)0x0) {
      operator_delete(local_178);
    }
    if ((pointer)local_198._0_8_ != (pointer)(local_198 + 0x10)) {
      operator_delete((void *)local_198._0_8_);
    }
    if (redeem_script != (Script *)0x0) {
      core::Script::operator=(redeem_script,&local_218);
    }
LAB_003b7c0a:
    redeem_script = witness_script;
    if (witness_script == (Script *)0x0) goto LAB_003b7c1f;
  }
  else {
    if (address_type == kP2wshAddress) {
      core::Address::Address((Address *)local_1a8,net_type,kVersion0,&local_1e0,&local_238);
      core::Address::operator=(__return_storage_ptr__,(Address *)local_1a8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
      core::Script::~Script(&local_a0);
      local_130._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_b8);
      core::TapBranch::~TapBranch(&local_130);
      if (local_148 != (pointer)0x0) {
        operator_delete(local_148);
      }
      if (local_160 != (pointer)0x0) {
        operator_delete(local_160);
      }
      if (local_178 != (pointer)0x0) {
        operator_delete(local_178);
      }
      if ((pointer)local_198._0_8_ != (pointer)(local_198 + 0x10)) {
        operator_delete((void *)local_198._0_8_);
      }
      goto LAB_003b7c0a;
    }
    if (address_type != kP2shAddress) {
      local_1a8._0_8_ = "cfdapi_address.cpp";
      local_1a8._8_4_ = 0xb1;
      local_198._0_8_ = "CreateMultisig";
      core::logger::log<cfd::core::AddressType&>
                ((CfdSourceLocation *)local_1a8,kCfdLogLevelWarning,
                 "Failed to CreateMultisig. Invalid address_type passed:  addressType={}",&local_21c
                );
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_1a8._0_8_ = local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,
                 "Invalid address_type. address_type must be \"p2sh\" \"p2wsh\" or \"p2sh-p2wsh\".",
                 "");
      core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_1a8);
      __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::Address::Address((Address *)local_1a8,net_type,&local_1e0,&local_238);
    core::Address::operator=(__return_storage_ptr__,(Address *)local_1a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_60);
    core::Script::~Script(&local_a0);
    local_130._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_b8)
    ;
    core::TapBranch::~TapBranch(&local_130);
    if (local_148 != (pointer)0x0) {
      operator_delete(local_148);
    }
    if (local_160 != (pointer)0x0) {
      operator_delete(local_160);
    }
    if (local_178 != (pointer)0x0) {
      operator_delete(local_178);
    }
    if ((pointer)local_198._0_8_ != (pointer)(local_198 + 0x10)) {
      operator_delete((void *)local_198._0_8_);
    }
    if (redeem_script == (Script *)0x0) goto LAB_003b7c1f;
  }
  core::Script::operator=(redeem_script,&local_1e0);
LAB_003b7c1f:
  core::Script::~Script(&local_218);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_238);
  core::Script::~Script(&local_1e0);
  return __return_storage_ptr__;
}

Assistant:

Address AddressApi::CreateMultisig(
    NetType net_type, AddressType address_type, uint32_t req_sig_num,
    const std::vector<Pubkey>& pubkeys, Script* redeem_script,
    Script* witness_script,
    const std::vector<AddressFormatData>* prefix_list) const {
  // Multisig redeem scriptの作成
  Script multisig_script =
      ScriptUtil::CreateMultisigRedeemScript(req_sig_num, pubkeys);

  std::vector<AddressFormatData> addr_prefixes;
  if (prefix_list == nullptr) {
    addr_prefixes = cfd::core::GetBitcoinAddressFormatList();
  } else {
    addr_prefixes = *prefix_list;
  }

  // Address作成
  Address addr;
  Script script;
  if (address_type == AddressType::kP2shAddress) {
    addr = Address(net_type, multisig_script, addr_prefixes);
    if (redeem_script != nullptr) {
      *redeem_script = multisig_script;
    }
  } else if (address_type == AddressType::kP2wshAddress) {
    // Currently we support only witness version 0.
    addr = Address(
        net_type, WitnessVersion::kVersion0, multisig_script, addr_prefixes);
    if (witness_script != nullptr) {
      *witness_script = multisig_script;
    }
  } else if (address_type == AddressType::kP2shP2wshAddress) {
    script = ScriptUtil::CreateP2wshLockingScript(multisig_script);
    addr = Address(net_type, script, addr_prefixes);
    if (redeem_script != nullptr) {
      *redeem_script = script;
    }
    if (witness_script != nullptr) {
      *witness_script = multisig_script;
    }
  } else {
    warn(
        CFD_LOG_SOURCE,
        "Failed to CreateMultisig. Invalid address_type passed:  "
        "addressType={}",  // NOLINT
        address_type);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid address_type. address_type must be \"p2sh\" "
        "\"p2wsh\" or \"p2sh-p2wsh\".");  // NOLINT
  }
  return addr;
}